

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O1

void rw::Matrix::mult_(Matrix *dst,Matrix *src1,Matrix *src2)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  
  fVar1 = (float)(src1->right).y;
  fVar2 = (float)(src2->up).x;
  fVar3 = (float)(src2->at).x;
  fVar4 = (float)(src1->right).z;
  (dst->right).x =
       (float32)(fVar4 * fVar3 + (float)(src1->right).x * (float)(src2->right).x + fVar1 * fVar2);
  fVar5 = (float)(src1->right).x;
  fVar6 = (float)(src2->up).y;
  fVar7 = (float)(src2->at).y;
  (dst->right).y = (float32)(fVar4 * fVar7 + (float)(src2->right).y * fVar5 + fVar1 * fVar6);
  fVar1 = (float)(src2->up).z;
  fVar8 = (float)(src2->at).z;
  (dst->right).z =
       (float32)(fVar4 * fVar8 + fVar5 * (float)(src2->right).z + (float)(src1->right).y * fVar1);
  fVar4 = (float)(src2->right).x;
  fVar5 = (float)(src1->up).y;
  fVar9 = (float)(src1->up).z;
  (dst->up).x = (float32)(fVar9 * fVar3 + (float)(src1->up).x * fVar4 + fVar2 * fVar5);
  fVar2 = (float)(src1->up).x;
  fVar10 = (float)(src2->right).y;
  (dst->up).y = (float32)(fVar9 * fVar7 + fVar2 * fVar10 + fVar6 * fVar5);
  fVar5 = (float)(src2->right).z;
  (dst->up).z = (float32)(fVar9 * fVar8 + fVar2 * fVar5 + fVar1 * (float)(src1->up).y);
  fVar1 = (float)(src2->up).x;
  fVar2 = (float)(src1->at).y;
  fVar6 = (float)(src1->at).z;
  (dst->at).x = (float32)(fVar3 * fVar6 + (float)(src1->at).x * fVar4 + fVar2 * fVar1);
  fVar3 = (float)(src1->at).x;
  fVar9 = (float)(src2->up).y;
  (dst->at).y = (float32)(fVar7 * fVar6 + fVar3 * fVar10 + fVar2 * fVar9);
  fVar2 = (float)(src2->up).z;
  (dst->at).z = (float32)(fVar6 * fVar8 + fVar3 * fVar5 + (float)(src1->at).y * fVar2);
  fVar3 = (float)(src1->pos).y;
  fVar6 = (float)(src1->pos).z;
  (dst->pos).x = (float32)((float)(src2->at).x * fVar6 +
                           fVar4 * (float)(src1->pos).x + fVar1 * fVar3 + (float)(src2->pos).x);
  fVar1 = (float)(src1->pos).x;
  (dst->pos).y = (float32)((float)(src2->at).y * fVar6 + fVar10 * fVar1 + fVar9 * fVar3 +
                          (float)(src2->pos).y);
  (dst->pos).z = (float32)(fVar6 * (float)(src2->at).z +
                           fVar1 * fVar5 + fVar2 * (float)(src1->pos).y + (float)(src2->pos).z);
  return;
}

Assistant:

void
Matrix::mult_(Matrix *dst, const Matrix *src1, const Matrix *src2)
{
	dst->right.x = src1->right.x*src2->right.x + src1->right.y*src2->up.x + src1->right.z*src2->at.x;
	dst->right.y = src1->right.x*src2->right.y + src1->right.y*src2->up.y + src1->right.z*src2->at.y;
	dst->right.z = src1->right.x*src2->right.z + src1->right.y*src2->up.z + src1->right.z*src2->at.z;
	dst->up.x    = src1->up.x*src2->right.x    + src1->up.y*src2->up.x    + src1->up.z*src2->at.x;
	dst->up.y    = src1->up.x*src2->right.y    + src1->up.y*src2->up.y    + src1->up.z*src2->at.y;
	dst->up.z    = src1->up.x*src2->right.z    + src1->up.y*src2->up.z    + src1->up.z*src2->at.z;
	dst->at.x    = src1->at.x*src2->right.x    + src1->at.y*src2->up.x    + src1->at.z*src2->at.x;
	dst->at.y    = src1->at.x*src2->right.y    + src1->at.y*src2->up.y    + src1->at.z*src2->at.y;
	dst->at.z    = src1->at.x*src2->right.z    + src1->at.y*src2->up.z    + src1->at.z*src2->at.z;
	dst->pos.x   = src1->pos.x*src2->right.x   + src1->pos.y*src2->up.x   + src1->pos.z*src2->at.x + src2->pos.x;
	dst->pos.y   = src1->pos.x*src2->right.y   + src1->pos.y*src2->up.y   + src1->pos.z*src2->at.y + src2->pos.y;
	dst->pos.z   = src1->pos.x*src2->right.z   + src1->pos.y*src2->up.z   + src1->pos.z*src2->at.z + src2->pos.z;
}